

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::RecyclableObjectWalker::InsertItem
          (RecyclableObjectWalker *this,PropertyId propertyId,bool isConst,bool isUnscoped,
          Var itemObj,RecyclableMethodsGroupWalker **ppMethodsGroupWalker,bool shouldPinProperty)

{
  int iVar1;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  PropertyRecord *propertyRecord;
  DebugContext *pDVar6;
  ArenaAllocator *alloc;
  RecyclableObject *this_02;
  RecyclableMethodsGroupWalker *this_03;
  DebuggerPropertyDisplayInfo *pDVar7;
  Type TVar8;
  
  if (propertyId == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9b,"(propertyId)","propertyId");
    if (!bVar3) goto LAB_008c4f5d;
    *puVar5 = 0;
  }
  if (ppMethodsGroupWalker == (RecyclableMethodsGroupWalker **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9c,"(ppMethodsGroupWalker)","ppMethodsGroupWalker");
    if (!bVar3) goto LAB_008c4f5d;
    *puVar5 = 0;
  }
  if (itemObj == (Var)0x0) {
    itemObj = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  if (shouldPinProperty) {
    propertyRecord = ScriptContext::GetPropertyName(this->scriptContext,propertyId);
    if (propertyRecord != (PropertyRecord *)0x0) {
      pDVar6 = ScriptContext::GetDebugContext(this->scriptContext);
      ProbeContainer::PinPropertyRecord(pDVar6->diagProbesContainer,propertyRecord);
    }
  }
  alloc = GetArenaFromContext(this->scriptContext);
  if ((RecyclableObject *)itemObj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_008c4f5d;
    *puVar5 = 0;
  }
  if (((ulong)itemObj & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)itemObj & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_008c4f5d;
    *puVar5 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)itemObj & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)itemObj >> 0x32 == 0)) {
    this_02 = UnsafeVarTo<Js::RecyclableObject>(itemObj);
    if (this_02 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_008c4f5d;
      *puVar5 = 0;
    }
    TVar8 = ((this_02->type).ptr)->typeId;
    if (0x57 < (int)TVar8) {
      BVar4 = RecyclableObject::IsExternal(this_02);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_008c4f5d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
  }
  if (TVar8 == TypeIds_Function) {
    if ((this->scriptContext->threadContext->debugManager->localsDisplayFlags & 1) == 0) {
      EnsureFakeGroupObjectWalkerList(this);
      if (*ppMethodsGroupWalker == (RecyclableMethodsGroupWalker *)0x0) {
        this_03 = (RecyclableMethodsGroupWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
        RecyclableMethodsGroupWalker::RecyclableMethodsGroupWalker
                  (this_03,this->scriptContext,this->instance);
        *ppMethodsGroupWalker = this_03;
        this_00 = this->fakeGroupObjectWalkerList;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(this_00,0);
        iVar1 = (this_00->
                super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (this_00->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar1] = (IDiagObjectModelWalkerBase *)this_03;
        (this_00->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar1 + 1;
      }
      RecyclableMethodsGroupWalker::AddItem(*ppMethodsGroupWalker,propertyId,itemObj);
      return;
    }
    pDVar7 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,alloc,0x366bee);
    pDVar7->propId = propertyId;
    pDVar7->aVar = itemObj;
    pDVar7->flags = 1;
  }
  else {
    pDVar7 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,alloc,0x366bee);
    pDVar7->propId = propertyId;
    pDVar7->aVar = itemObj;
    pDVar7->flags = (uint)isConst + (uint)isUnscoped * 4;
  }
  this_01 = this->pMembersList;
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_01,0);
  iVar1 = (this_01->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  (this_01->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer[iVar1] = pDVar7;
  (this_01->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = iVar1 + 1;
  return;
}

Assistant:

void RecyclableObjectWalker::InsertItem(
        PropertyId propertyId,
        bool isConst,
        bool isUnscoped,
        Var itemObj,
        Js:: RecyclableMethodsGroupWalker **ppMethodsGroupWalker,
        bool shouldPinProperty /* = false*/)
    {
        Assert(propertyId);
        Assert(ppMethodsGroupWalker);

        if (itemObj == nullptr)
        {
            itemObj = scriptContext->GetLibrary()->GetUndefined();
        }

        if (shouldPinProperty)
        {
            const Js::PropertyRecord * propertyRecord = scriptContext->GetPropertyName(propertyId);
            if (propertyRecord)
            {
                // Pin this record so that it will not go away till we are done with this break.
                scriptContext->GetDebugContext()->GetProbeContainer()->PinPropertyRecord(propertyRecord);
            }
        }

        ArenaAllocator *arena = GetArenaFromContext(scriptContext);

        if (JavascriptOperators::GetTypeId(itemObj) == TypeIds_Function)
        {
            if (scriptContext->GetThreadContext()->GetDebugManager()->IsLocalsDisplayFlagsSet(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods))
            {
                DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, DebuggerPropertyDisplayInfoFlags_Const);
                pMembersList->Add(info);
            }
            else
            {
                EnsureFakeGroupObjectWalkerList();

                if (*ppMethodsGroupWalker == nullptr)
                {
                    *ppMethodsGroupWalker = Anew(arena, RecyclableMethodsGroupWalker, scriptContext, instance);
                    fakeGroupObjectWalkerList->Add(*ppMethodsGroupWalker);
                }

                (*ppMethodsGroupWalker)->AddItem(propertyId, itemObj);
            }
        }
        else
        {
            DWORD flags = DebuggerPropertyDisplayInfoFlags_None;
            flags |= isConst ? DebuggerPropertyDisplayInfoFlags_Const : 0;
            flags |= isUnscoped ? DebuggerPropertyDisplayInfoFlags_Unscope : 0;

            DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, flags);

            pMembersList->Add(info);
        }
    }